

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleTestMode(cmSetPropertyCommand *this)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  _Base_ptr p_Var3;
  cmTest *test;
  ostream *poVar4;
  _Base_ptr p_Var5;
  const_iterator __position;
  ostringstream e;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  __position._M_node = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->Names)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    do {
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      test = cmMakefile::GetTest((this->super_cmCommand).Makefile,(string *)(__position._M_node + 1)
                                );
      if (test != (cmTest *)0x0) {
        HandleTest(this,test);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&this->Names,__position);
      }
      __position._M_node = p_Var3;
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  sVar2 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar2 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"given TEST names that do not exist:\n",0x24);
    p_Var5 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return sVar2 == 0;
}

Assistant:

bool cmSetPropertyCommand::HandleTestMode()
{
  // Look for tests with all names given.
  std::set<std::string>::iterator next;
  for (std::set<std::string>::iterator ni = this->Names.begin();
       ni != this->Names.end(); ni = next) {
    next = ni;
    ++next;
    if (cmTest* test = this->Makefile->GetTest(*ni)) {
      if (this->HandleTest(test)) {
        this->Names.erase(ni);
      } else {
        return false;
      }
    }
  }

  // Names that are still left were not found.
  if (!this->Names.empty()) {
    std::ostringstream e;
    e << "given TEST names that do not exist:\n";
    for (std::string const& name : this->Names) {
      e << "  " << name << "\n";
    }
    this->SetError(e.str());
    return false;
  }
  return true;
}